

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::load_simulation::~load_simulation(load_simulation *this)

{
  load_simulation *this_local;
  
  ~load_simulation(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      build_libs();
      g_my_address = (uint64_t)this;

      external_function ef;
      ef.name = "my-address";
      ef.address = (uint64_t)&get_my_address;
      ef.return_type = external_function::T_INT64;
      externals[ef.name] = ef;

      ef.name = "load-simulation";
      ef.address = (uint64_t)&scm_load_simulation;
      ef.return_type = external_function::T_VOID;
      ef.arguments.push_back(external_function::T_INT64);
      ef.arguments.push_back(external_function::T_CHAR_POINTER);
      externals[ef.name] = ef;

      run("(define addr (foreign-call my-address))");
      run("(foreign-call load-simulation addr \"13\")");

      int sz = (int)std::distance(env->begin(), env->end());
      printf("Environment has %d elements\n", sz);

      run("(foreign-call load-simulation addr \"(define x 14)\")");

      sz = (int)std::distance(env->begin(), env->end());
      printf("Environment has %d elements\n", sz);

      TEST_EQ("14", run("x"));
      }